

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevolute::IntLoadResidual_CqL
          (ChLinkRevolute *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c)

{
  int iVar1;
  CoeffReturnType pdVar2;
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    ChConstraintTwoBodies::MultiplyTandAdd(&this->m_cnstr_x,R,c * *pdVar2);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 1));
    ChConstraintTwoBodies::MultiplyTandAdd(&this->m_cnstr_y,R,c * *pdVar2);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 2));
    ChConstraintTwoBodies::MultiplyTandAdd(&this->m_cnstr_z,R,c * *pdVar2);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 3));
    ChConstraintTwoBodies::MultiplyTandAdd(&this->m_cnstr_uw,R,c * *pdVar2);
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 4));
    ChConstraintTwoBodies::MultiplyTandAdd(&this->m_cnstr_vw,R,c * *pdVar2);
    return;
  }
  return;
}

Assistant:

void ChLinkRevolute::IntLoadResidual_CqL(const unsigned int off_L,    ///< offset in L multipliers
                                         ChVectorDynamic<>& R,        ///< result: the R residual, R += c*Cq'*L
                                         const ChVectorDynamic<>& L,  ///< the L vector
                                         const double c               ///< a scaling factor
                                         ) {
    if (!IsActive())
        return;

    m_cnstr_x.MultiplyTandAdd(R, L(off_L + 0) * c);
    m_cnstr_y.MultiplyTandAdd(R, L(off_L + 1) * c);
    m_cnstr_z.MultiplyTandAdd(R, L(off_L + 2) * c);
    m_cnstr_uw.MultiplyTandAdd(R, L(off_L + 3) * c);
    m_cnstr_vw.MultiplyTandAdd(R, L(off_L + 4) * c);
}